

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O0

QLibraryScanResult scanProgramHeadersForNotes(QByteArrayView data,ErrorMaker *error)

{
  QLibraryScanResult QVar1;
  anon_class_16_2_fc6cae53 f;
  QByteArrayView data_00;
  QNoDebug *pQVar2;
  storage_type *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qptrdiff PayloadStartDelta;
  size_t NoteAlignment;
  size_t NoteNameSize;
  qptrdiff MinNoteSize;
  size_t MinPayloadSize;
  anon_class_16_2_fc6cae53 noteFinder;
  QLibraryScanResult r;
  ErrorMaker *error_00;
  QByteArrayView *pQVar3;
  QLibraryScanResult *pQVar4;
  qsizetype qVar5;
  QNoDebug local_59;
  undefined8 *local_58;
  qsizetype *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 *local_38;
  qsizetype *local_30;
  undefined8 local_28;
  undefined8 local_20;
  qsizetype local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = 6;
  pQVar4 = (QLibraryScanResult *)0x22;
  pQVar3 = (QByteArrayView *)0xc;
  error_00 = (ErrorMaker *)0x18;
  local_28 = in_RDI;
  local_20 = in_RSI;
  memset(&local_18,0,0x10);
  local_58 = &local_28;
  local_50 = &local_18;
  local_48 = local_28;
  local_40 = local_20;
  data_00.m_data = in_RDX;
  data_00.m_size = qVar5;
  f.r = pQVar4;
  f.data = pQVar3;
  local_38 = local_58;
  local_30 = local_50;
  scanProgramHeaders<scanProgramHeadersForNotes(QByteArrayView,(anonymous_namespace)::ErrorMaker_const&)::__0>
            (data_00,error_00,f);
  if (local_10 != 0) {
    pQVar2 = QNoDebug::operator<<(&local_59,(char (*) [33])"found Qt metadata in ELF note at");
    pQVar2 = QNoDebug::operator<<(pQVar2,Qt::hex);
    pQVar2 = QNoDebug::operator<<(pQVar2,Qt::showbase);
    pQVar2 = QNoDebug::operator<<(pQVar2,&local_18);
    pQVar2 = QNoDebug::operator<<(pQVar2,(char (*) [5])0xa195ae);
    pQVar2 = QNoDebug::operator<<(pQVar2,Qt::reset);
    QNoDebug::operator<<(pQVar2,&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.length = local_10;
  QVar1.pos = local_18;
  return QVar1;
}

Assistant:

static QLibraryScanResult scanProgramHeadersForNotes(QByteArrayView data, const ErrorMaker &error)
{
    // minimum metadata payload is 2 bytes
    constexpr size_t MinPayloadSize = sizeof(QPluginMetaData::Header) + 2;
    constexpr qptrdiff MinNoteSize = sizeof(QPluginMetaData::ElfNoteHeader) + 2;
    constexpr size_t NoteNameSize = sizeof(QPluginMetaData::ElfNoteHeader::name);
    constexpr size_t NoteAlignment = alignof(QPluginMetaData::ElfNoteHeader);
    constexpr qptrdiff PayloadStartDelta = offsetof(QPluginMetaData::ElfNoteHeader, header);
    static_assert(MinNoteSize > PayloadStartDelta);
    static_assert((PayloadStartDelta & (NoteAlignment - 1)) == 0);

    QLibraryScanResult r = {};
    auto noteFinder = [&](const T::Phdr *phdr) {
        if (phdr->p_type != PT_NOTE || phdr->p_align != NoteAlignment)
            return true;

        // check for signed integer overflows, to avoid issues with the
        // arithmetic below
        if (qptrdiff(phdr->p_filesz) < 0) {
            auto h = reinterpret_cast<const T::Ehdr *>(data.data());
            auto segments = reinterpret_cast<const T::Phdr *>(data.data() + h->e_phoff);
            qEDebug << "segment" << (phdr - segments) << "contains a note with size"
                    << Qt::hex << Qt::showbase << phdr->p_filesz
                    << "which is larger than half the virtual memory space";
            return true;
        }

        // iterate over the notes in this segment
        T::Off offset = phdr->p_offset;
        const T::Off end_offset = offset + phdr->p_filesz;
        while (qptrdiff(end_offset - offset) >= MinNoteSize) {
            auto nhdr = reinterpret_cast<const T::Nhdr *>(data.data() + offset);
            T::Word n_namesz = nhdr->n_namesz;
            T::Word n_descsz = nhdr->n_descsz;
            T::Word n_type = nhdr->n_type;

            // overflow check: calculate where the next note will be, if it exists
            T::Off next_offset = offset;
            next_offset += sizeof(T::Nhdr);          // can't overflow (we checked above)
            next_offset += NoteAlignment - 3;        // offset is aligned, this can't overflow
            if (qAddOverflow<T::Off>(next_offset, n_namesz, &next_offset))
                break;
            next_offset &= -NoteAlignment;

            next_offset += NoteAlignment - 3;        // offset is aligned, this can't overflow
            if (qAddOverflow<T::Off>(next_offset, n_descsz, &next_offset))
                break;
            next_offset &= -NoteAlignment;
            if (next_offset > end_offset)
                break;

            if (n_namesz == NoteNameSize && n_descsz >= MinPayloadSize
                    && n_type == QPluginMetaData::ElfNoteHeader::NoteType
                    && memcmp(nhdr + 1, QPluginMetaData::ElfNoteHeader::NoteName, NoteNameSize) == 0) {
                // yes, it's our note
                r.pos = offset + PayloadStartDelta;
                r.length = nhdr->n_descsz;
                return false;
            }
            offset = next_offset;
        }
        return true;
    };
    scanProgramHeaders(data, error, noteFinder);

    if (!r.length)
        return r;

    qEDebug << "found Qt metadata in ELF note at"
                << Qt::hex << Qt::showbase << r.pos << "size" << Qt::reset << r.length;
    return r;
}